

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O1

iterator * __thiscall
obs::safe_list<Observer>::end(iterator *__return_storage_ptr__,safe_list<Observer> *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    iterator::iterator(__return_storage_ptr__,this,this->m_last);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

iterator end() {
    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    return iterator(*this, m_last);
  }